

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::ReferenceRenderTimeCase::runSample
          (ReferenceRenderTimeCase *this,SampleResult *sample)

{
  pointer *ppuVar1;
  code *pcVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  PixelBufferAccess local_e8;
  deUint64 local_c0;
  deUint64 endTime;
  deUint64 startTime;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexData;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertexData;
  Buffer indexBuffer;
  undefined1 local_58 [8];
  Buffer arrayBuffer;
  undefined1 local_38 [4];
  int numVertices;
  Surface resultSurface;
  Functions *gl;
  SampleResult *sample_local;
  ReferenceRenderTimeCase *this_local;
  
  pRVar5 = gles3::Context::getRenderContext
                     ((this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                      ).super_RenderPerformanceTestBase.super_TestCase.m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  resultSurface.m_pixels.m_cap = CONCAT44(extraout_var,iVar3);
  tcu::Surface::Surface((Surface *)local_38,0x80,0x80);
  arrayBuffer.super_ObjectWrapper._20_4_ = getLayeredGridNumVertices(&sample->scene);
  pRVar5 = gles3::Context::getRenderContext
                     ((this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                      ).super_RenderPerformanceTestBase.super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_58,pRVar5);
  pRVar5 = gles3::Context::getRenderContext
                     ((this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                      ).super_RenderPerformanceTestBase.super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)
             &vertexData.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,pRVar5);
  ppuVar1 = &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)ppuVar1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&startTime);
  generateLayeredGridVertexAttribData4C4V
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)ppuVar1,
             &sample->scene);
  pcVar2 = *(code **)(resultSurface.m_pixels.m_cap + 0x40);
  dVar4 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_58);
  (*pcVar2)(0x8892,dVar4);
  pcVar2 = *(code **)(resultSurface.m_pixels.m_cap + 0x150);
  ppuVar1 = &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                    ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                     ppuVar1);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      ppuVar1,0);
  (*pcVar2)(0x8892,(long)((int)sVar6 << 4),pvVar7,0x88e4);
  if ((this->super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>).
      m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
    generateLayeredGridIndexData
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&startTime,&sample->scene);
    pcVar2 = *(code **)(resultSurface.m_pixels.m_cap + 0x40);
    dVar4 = glu::ObjectWrapper::operator*
                      ((ObjectWrapper *)
                       &vertexData.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    (*pcVar2)(0x8893,dVar4);
    pcVar2 = *(code **)(resultSurface.m_pixels.m_cap + 0x150);
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&startTime);
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&startTime,0);
    (*pcVar2)(0x8893,(long)((int)sVar6 << 2),pvVar8,0x88e4);
  }
  RenderPerformanceTestBase::setupVertexAttribs((RenderPerformanceTestBase *)this);
  if ((this->super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>).
      m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) {
    (**(code **)(resultSurface.m_pixels.m_cap + 0x538))(4,0,arrayBuffer.super_ObjectWrapper._20_4_);
  }
  else if ((this->
           super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>).
           m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
    (**(code **)(resultSurface.m_pixels.m_cap + 0x568))
              (4,arrayBuffer.super_ObjectWrapper._20_4_,0x1405,0);
  }
  RenderPerformanceTestBase::waitGLResults((RenderPerformanceTestBase *)this);
  (**(code **)(resultSurface.m_pixels.m_cap + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(resultSurface.m_pixels.m_cap + 0x188))(0x4000);
  RenderPerformanceTestBase::waitGLResults((RenderPerformanceTestBase *)this);
  tcu::warmupCPU();
  endTime = deGetMicroseconds();
  if ((this->super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>).
      m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) {
    (**(code **)(resultSurface.m_pixels.m_cap + 0x538))(4,0,arrayBuffer.super_ObjectWrapper._20_4_);
  }
  else if ((this->
           super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>).
           m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
    (**(code **)(resultSurface.m_pixels.m_cap + 0x568))
              (4,arrayBuffer.super_ObjectWrapper._20_4_,0x1405,0);
  }
  local_c0 = deGetMicroseconds();
  (sample->result).duration.renderDuration = local_c0 - endTime;
  endTime = deGetMicroseconds();
  pRVar5 = gles3::Context::getRenderContext
                     ((this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                      ).super_RenderPerformanceTestBase.super_TestCase.m_context);
  tcu::Surface::getAccess(&local_e8,(Surface *)local_38);
  glu::readPixels(pRVar5,0,0,&local_e8);
  local_c0 = deGetMicroseconds();
  (sample->result).duration.readDuration = local_c0 - endTime;
  iVar3 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::
          getVertexDataSize(&this->
                             super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                           );
  (sample->result).renderDataSize = iVar3 * (sample->result).numVertices;
  (sample->result).uploadedDataSize = 0;
  (sample->result).unrelatedDataSize = 0;
  (sample->result).duration.renderReadDuration =
       (sample->result).duration.renderDuration + (sample->result).duration.readDuration;
  (sample->result).duration.totalDuration =
       (sample->result).duration.renderDuration + (sample->result).duration.readDuration;
  (sample->result).duration.fitResponseDuration = (sample->result).duration.renderReadDuration;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&startTime);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)
             &vertexData.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_58);
  tcu::Surface::~Surface((Surface *)local_38);
  return;
}

Assistant:

void ReferenceRenderTimeCase::runSample (SampleResult& sample)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	tcu::Surface			resultSurface	(RENDER_AREA_SIZE, RENDER_AREA_SIZE);
	const int				numVertices		= getLayeredGridNumVertices(sample.scene);
	const glu::Buffer		arrayBuffer		(m_context.getRenderContext());
	const glu::Buffer		indexBuffer		(m_context.getRenderContext());
	std::vector<tcu::Vec4>	vertexData;
	std::vector<deUint32>	indexData;
	deUint64				startTime;
	deUint64				endTime;

	// generate and upload buffers

	generateLayeredGridVertexAttribData4C4V(vertexData, sample.scene);
	gl.bindBuffer(GL_ARRAY_BUFFER, *arrayBuffer);
	gl.bufferData(GL_ARRAY_BUFFER, (int)(vertexData.size() * sizeof(tcu::Vec4)), &vertexData[0], GL_STATIC_DRAW);

	if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
	{
		generateLayeredGridIndexData(indexData, sample.scene);
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, *indexBuffer);
		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (int)(indexData.size() * sizeof(deUint32)), &indexData[0], GL_STATIC_DRAW);
	}

	setupVertexAttribs();

	// make sure data is uploaded

	if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS)
		gl.drawArrays(GL_TRIANGLES, 0, numVertices);
	else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
		gl.drawElements(GL_TRIANGLES, numVertices, GL_UNSIGNED_INT, DE_NULL);
	else
		DE_ASSERT(false);
	waitGLResults();

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);
	waitGLResults();

	tcu::warmupCPU();

	// Measure both draw and associated readpixels
	{
		startTime = deGetMicroseconds();

		if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS)
			gl.drawArrays(GL_TRIANGLES, 0, numVertices);
		else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
			gl.drawElements(GL_TRIANGLES, numVertices, GL_UNSIGNED_INT, DE_NULL);
		else
			DE_ASSERT(false);

		endTime = deGetMicroseconds();

		sample.result.duration.renderDuration = endTime - startTime;
	}

	{
		startTime = deGetMicroseconds();
		glu::readPixels(m_context.getRenderContext(), 0, 0, resultSurface.getAccess());
		endTime = deGetMicroseconds();

		sample.result.duration.readDuration = endTime - startTime;
	}

	sample.result.renderDataSize = getVertexDataSize() * sample.result.numVertices;
	sample.result.uploadedDataSize = 0;
	sample.result.unrelatedDataSize = 0;
	sample.result.duration.renderReadDuration = sample.result.duration.renderDuration + sample.result.duration.readDuration;
	sample.result.duration.totalDuration = sample.result.duration.renderDuration + sample.result.duration.readDuration;
	sample.result.duration.fitResponseDuration = sample.result.duration.renderReadDuration;
}